

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mesh.cpp
# Opt level: O1

LOs __thiscall
Omega_h::ents_on_closure
          (Omega_h *this,Mesh *mesh,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *class_names,Int ent_dim)

{
  int *piVar1;
  Alloc *pAVar2;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  LOs LVar4;
  Read<signed_char> ents_are_on;
  vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_> class_pairs;
  Read<signed_char> local_58;
  Alloc *local_48;
  void *local_40;
  vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_> local_38;
  void *pvVar3;
  
  to_class_pairs(&local_38,mesh,class_names);
  mark_class_closures((Omega_h *)&local_48,mesh,ent_dim,&local_38);
  local_58.write_.shared_alloc_.alloc = local_48;
  if (((ulong)local_48 & 7) == 0 && local_48 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_58.write_.shared_alloc_.alloc = (Alloc *)(local_48->size * 8 + 1);
    }
    else {
      local_48->use_count = local_48->use_count + 1;
    }
  }
  local_58.write_.shared_alloc_.direct_ptr = local_40;
  LVar4 = collect_marked(this,&local_58);
  pAVar2 = local_58.write_.shared_alloc_.alloc;
  pvVar3 = LVar4.write_.shared_alloc_.direct_ptr;
  if (((ulong)local_58.write_.shared_alloc_.alloc & 7) == 0 &&
      local_58.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_58.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_58.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar3 = extraout_RDX;
    }
  }
  if (((ulong)local_48 & 7) == 0 && local_48 != (Alloc *)0x0) {
    piVar1 = &local_48->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_48);
      operator_delete(local_48,0x48);
      pvVar3 = extraout_RDX_00;
    }
  }
  if (local_38.super__Vector_base<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.
                    super__Vector_base<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    pvVar3 = extraout_RDX_01;
  }
  LVar4.write_.shared_alloc_.direct_ptr = pvVar3;
  LVar4.write_.shared_alloc_.alloc = (Alloc *)this;
  return (LOs)LVar4.write_.shared_alloc_;
}

Assistant:

LOs ents_on_closure(
    Mesh* mesh, std::set<std::string> const& class_names, Int ent_dim) {
  auto class_pairs = to_class_pairs(mesh, class_names);
  auto ents_are_on = mark_class_closures(mesh, ent_dim, class_pairs);
  return collect_marked(ents_are_on);
}